

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperSTRNE
          (internal *this,char *s1_expression,char *s2_expression,wchar_t *s1,wchar_t *s2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  wchar_t **value;
  wchar_t **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar4;
  AssertionResult local_80;
  wchar_t *local_70;
  wchar_t *s2_local;
  wchar_t *s1_local;
  char *s2_expression_local;
  char *s1_expression_local;
  string local_30;
  long local_10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = s2;
  s2_local = s1;
  s1_local = (wchar_t *)s2_expression;
  s2_expression_local = s1_expression;
  bVar1 = String::WideCStringEquals(s1,s2);
  if (bVar1) {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_80,(char (*) [12])"Expected: (");
    pAVar2 = AssertionResult::operator<<(pAVar2,&s2_expression_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&s1_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"), actual: ");
    PrintToString<wchar_t_const*>(&local_30,(testing *)&s2_local,value);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_30);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
    PrintToString<wchar_t_const*>((string *)&s1_expression_local,(testing *)&local_70,value_00);
    pAVar2 = AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &s1_expression_local);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    std::__cxx11::string::~string((string *)&s1_expression_local);
    std::__cxx11::string::~string((string *)&local_30);
    AssertionResult::~AssertionResult(&local_80);
    sVar3.ptr_ = extraout_RDX;
  }
  else {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    AVar4.message_.ptr_ = sVar3.ptr_;
    AVar4._0_8_ = this;
    return AVar4;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperSTRNE(const char* s1_expression,
                               const char* s2_expression,
                               const wchar_t* s1,
                               const wchar_t* s2) {
  if (!String::WideCStringEquals(s1, s2)) {
    return AssertionSuccess();
  }

  return AssertionFailure() << "Expected: (" << s1_expression << ") != ("
                            << s2_expression << "), actual: "
                            << PrintToString(s1)
                            << " vs " << PrintToString(s2);
}